

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorTest_mallocLeakGivesAdditionalWarning_Test::testBody
          (TEST_MemoryLeakDetectorTest_mallocLeakGivesAdditionalWarning_Test *this)

{
  MemoryLeakDetector *this_00;
  TestMemoryAllocator *allocator;
  char *pcVar1;
  char *pcVar2;
  UtestShell *pUVar3;
  SimpleString output;
  SimpleString local_20;
  
  this_00 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  allocator = defaultMallocAllocator();
  pcVar1 = MemoryLeakDetector::allocMemory(this_00,allocator,100,"ALLOC.c",10,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pcVar2 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString(&local_20,pcVar2);
  pUVar3 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString(&local_20);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,
             "Memory leak reports about malloc and free can be caused by allocating using the cpputest version of malloc"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x194);
  (*PlatformSpecificFree)(pcVar1);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, mallocLeakGivesAdditionalWarning)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 100, "ALLOC.c", 10);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    STRCMP_CONTAINS("Memory leak reports about malloc and free can be caused by allocating using the cpputest version of malloc", output.asCharString());
    PlatformSpecificFree(mem);
}